

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::resizeFile(Forth *this)

{
  Cell CVar1;
  byte bVar2;
  uint uVar3;
  uint valueHi;
  openmode oVar4;
  element_type *peVar5;
  basic_fstream<char,_std::char_traits<char>_> *__p;
  exception *anon_var_0;
  string local_138;
  undefined1 local_118 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> fnew;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  string filename;
  string local_90;
  openmode local_6c;
  anon_union_8_4_a234c5df_for_data_ aStack_68;
  openmode fam;
  DCell ud;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,3,"RESIZE-FILE");
  f.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar3 = f.
          super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"RESIZE-FILE",&local_49);
  GetFileHandle((Forth *)local_28,(Cell)this,(string *)(ulong)uVar3,(errorCodes)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack);
  DCell::DCell((DCell *)&stack0xffffffffffffff98,uVar3,valueHi);
  ForthStack<unsigned_int>::pop(&this->dStack);
  CVar1 = f.
          super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"RESIZE-FILE",
             (allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  oVar4 = GetFileAccessMode(this,CVar1,&local_90,errorResizeFile);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  CVar1 = f.
          super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_;
  local_6c = oVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"RESIZE-FILE",&local_d9);
  GetFileName((string *)local_b8,this,CVar1,&local_d8,errorResizeFile);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  peVar5 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::ios::clear((int)peVar5 + (int)*(undefined8 *)(*(long *)peVar5 + -0x18));
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  std::fstream::close();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&fnew.
                      super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             auto_format);
  std::filesystem::resize_file
            ((path *)&fnew.
                      super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,aStack_68.Dcells);
  std::filesystem::__cxx11::path::~path
            ((path *)&fnew.
                      super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  __p = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
  std::fstream::fstream(__p,(string *)local_b8,local_6c);
  std::shared_ptr<std::fstream>::shared_ptr<std::fstream,void>
            ((shared_ptr<std::fstream> *)local_118,__p);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_118);
  bVar2 = std::fstream::is_open();
  CVar1 = f.
          super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_;
  if ((bVar2 & 1) == 0) {
    ForthStack<unsigned_int>::setTop(&this->dStack,0xffffffb6);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"RESIZE-FILE",(allocator<char> *)((long)&anon_var_0 + 7));
    MoveFileHandle(this,CVar1,
                   (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_118,
                   &local_138,errorResizeFile);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    ForthStack<unsigned_int>::setTop(&this->dStack,0);
  }
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_118);
  std::__cxx11::string::~string((string *)local_b8);
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_28);
  return;
}

Assistant:

void resizeFile() {
	REQUIRE_DSTACK_DEPTH(3, "RESIZE-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "RESIZE-FILE", errorResizeFile);
	DCell ud(dStack.getTop(1), dStack.getTop()); dStack.pop();

	auto fam = GetFileAccessMode(h, "RESIZE-FILE", errorResizeFile);
	std::string filename=GetFileName(h, "RESIZE-FILE", errorResizeFile);
	f->clear();
	f->close();
	std::filesystem::resize_file(filename,ud.data_.Dcells);
	try {
		std::shared_ptr<std::fstream> fnew{ new std::fstream(filename, fam  ) };
		if (fnew->is_open()) {
			//auto filesize = std::filesystem::file_size(filename);
			MoveFileHandle(h,  fnew,  "RESIZE-FILE", errorResizeFile);
			dStack.setTop(0);
		}
		else {
			dStack.setTop(Cell(errorResizeFile));
		}
	}
	catch (std::exception&) {
		dStack.setTop(Cell(errorResizeFile));
	}
}